

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

string * __thiscall
mocker::ir::Builder::getTypeIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  shared_ptr<mocker::ast::BuiltinType> p;
  allocator<char> local_29;
  shared_ptr<mocker::ast::Type> local_28;
  
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>(&local_28);
  if (local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::dynamic_pointer_cast<mocker::ast::UserDefinedType,mocker::ast::Type>(&local_28);
    if (local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>(&local_28);
      if (local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3d8,
                      "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                     );
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"_array_",&local_29);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 (local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  [1].super_ASTNode._vptr_ASTNode + 3));
    }
  }
  else {
    if (*(int *)&local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 [1].super_ASTNode._vptr_ASTNode != 2) {
      __assert_fail("p->type == ast::BuiltinType::String",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                    ,0x3cf,
                    "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                   );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_29);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return __return_storage_ptr__;
}

Assistant:

std::string
Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    assert(p->type == ast::BuiltinType::String);
    return "string";
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return p->name->val;
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return "_array_";
  }
  assert(false);
}